

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_std_convert.cpp
# Opt level: O1

void test_one<wchar_t>(locale *l,string *src,string *tgtl,string *tgtu)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  converter<wchar_t> *pcVar4;
  ostream *poVar5;
  runtime_error *prVar6;
  bool bVar7;
  string local_c0;
  string local_a0;
  locale local_80 [8];
  locale local_78 [8];
  locale local_70 [8];
  locale local_68 [8];
  locale local_60 [8];
  string local_58;
  locale local_38 [8];
  
  test_counter = test_counter + 1;
  std::locale::locale(local_38,l);
  to_correct_string<wchar_t>(&local_a0,(locale *)src);
  pcVar4 = std::use_facet<booster::locale::converter<wchar_t>>(l);
  (**(code **)(*(long *)pcVar4 + 0x10))
            (&local_c0,pcVar4,1,local_a0._M_dataplus._M_p,
             local_a0._M_dataplus._M_p + local_a0._M_string_length * 4,0);
  std::locale::locale(local_60,l);
  to_correct_string<wchar_t>(&local_58,(locale *)tgtu);
  if (local_c0._M_string_length == local_58._M_string_length) {
    if (local_c0._M_string_length == 0) {
      bVar7 = true;
    }
    else {
      iVar3 = wmemcmp((wchar_t *)local_c0._M_dataplus._M_p,(wchar_t *)local_58._M_dataplus._M_p,
                      local_c0._M_string_length);
      bVar7 = iVar3 == 0;
    }
  }
  else {
    bVar7 = false;
  }
  paVar2 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  std::locale::~locale(local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  paVar1 = &local_a0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  std::locale::~locale(local_38);
  if (!bVar7) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1f);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,
               " booster::locale::to_upper(to_correct_string<CharType>(src,l),l) == to_correct_string<CharType>(tgtu,l)"
               ,0x67);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    iVar3 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar7) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar6,&local_c0);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::locale::locale(local_68,l);
  to_correct_string<wchar_t>(&local_a0,(locale *)src);
  pcVar4 = std::use_facet<booster::locale::converter<wchar_t>>(l);
  (**(code **)(*(long *)pcVar4 + 0x10))
            (&local_c0,pcVar4,2,local_a0._M_dataplus._M_p,
             local_a0._M_dataplus._M_p + local_a0._M_string_length * 4,0);
  std::locale::locale(local_70,l);
  to_correct_string<wchar_t>(&local_58,(locale *)tgtl);
  if (local_c0._M_string_length == local_58._M_string_length) {
    if (local_c0._M_string_length == 0) {
      bVar7 = true;
    }
    else {
      iVar3 = wmemcmp((wchar_t *)local_c0._M_dataplus._M_p,(wchar_t *)local_58._M_dataplus._M_p,
                      local_c0._M_string_length);
      bVar7 = iVar3 == 0;
    }
  }
  else {
    bVar7 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  std::locale::~locale(local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  std::locale::~locale(local_68);
  if (!bVar7) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,
               " booster::locale::to_lower(to_correct_string<CharType>(src,l),l) == to_correct_string<CharType>(tgtl,l)"
               ,0x67);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    iVar3 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar7) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar6,&local_c0);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::locale::locale(local_78,l);
  to_correct_string<wchar_t>(&local_a0,(locale *)src);
  pcVar4 = std::use_facet<booster::locale::converter<wchar_t>>(l);
  (**(code **)(*(long *)pcVar4 + 0x10))
            (&local_c0,pcVar4,3,local_a0._M_dataplus._M_p,
             local_a0._M_dataplus._M_p + local_a0._M_string_length * 4,0);
  std::locale::locale(local_80,l);
  to_correct_string<wchar_t>(&local_58,(locale *)tgtl);
  if (local_c0._M_string_length == local_58._M_string_length) {
    if (local_c0._M_string_length == 0) {
      bVar7 = true;
    }
    else {
      iVar3 = wmemcmp((wchar_t *)local_c0._M_dataplus._M_p,(wchar_t *)local_58._M_dataplus._M_p,
                      local_c0._M_string_length);
      bVar7 = iVar3 == 0;
    }
  }
  else {
    bVar7 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  std::locale::~locale(local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  std::locale::~locale(local_78);
  if (!bVar7) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x21);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,
               " booster::locale::fold_case(to_correct_string<CharType>(src,l),l) == to_correct_string<CharType>(tgtl,l)"
               ,0x68);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    iVar3 = error_counter + 1;
    bVar7 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar7) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar6,&local_c0);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void test_one(std::locale const &l,std::string src,std::string tgtl,std::string tgtu)
{
    TEST(booster::locale::to_upper(to_correct_string<CharType>(src,l),l) == to_correct_string<CharType>(tgtu,l));
    TEST(booster::locale::to_lower(to_correct_string<CharType>(src,l),l) == to_correct_string<CharType>(tgtl,l));
    TEST(booster::locale::fold_case(to_correct_string<CharType>(src,l),l) == to_correct_string<CharType>(tgtl,l));
}